

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

void embree::avx512::InstanceArrayIntersectorK<16>::intersect
               (vbool<16> *valid_i,Precalculations *pre,RayHitK<16> *ray,RayQueryContext *context,
               Primitive_conflict4 *prim)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  RTCFormat RVar5;
  InstanceArray *this;
  RTCRayQueryContext *pRVar6;
  RawBufferView *pRVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  Accel *pAVar11;
  ulong uVar12;
  long lVar13;
  ushort uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  vfloat4 a0_2;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vfloat4 a0;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM1 [64];
  undefined4 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_ZMM2 [64];
  int iVar49;
  vfloat4 a0_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar68;
  float fVar69;
  vfloat4 a1;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  RayQueryContext newcontext;
  vint<16> mask;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [2] [64];
  
  auVar20 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  a0_1.field_0 = in_ZMM3._0_16_;
  auVar19 = in_ZMM2._0_16_;
  uVar14 = valid_i->v;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar11 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (pAVar11 != (Accel *)0x0) {
    auVar24 = vpbroadcastd_avx512f(ZEXT416((this->super_Geometry).mask));
    uVar9 = vptestmd_avx512f(auVar24,*(undefined1 (*) [64])(ray + 0x240));
    uVar14 = uVar14 & (ushort)uVar9;
    if ((uVar14 != 0) && (pRVar6 = context->user, pRVar6->instID[0] == 0xffffffff)) {
      auVar15._8_8_ = 0;
      auVar15._0_4_ = prim->primID_;
      auVar15._4_4_ = prim->instID_;
      auVar15 = vprolq_avx512vl(auVar15,0x20);
      *pRVar6 = auVar15._0_8_;
      uVar12 = (ulong)prim->primID_;
      pRVar7 = (this->l2w_buf).items;
      RVar5 = pRVar7->format;
      if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
        if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar13 = uVar12 * pRVar7->stride;
          auVar19 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x10)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar19,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x20)),0x28);
          auVar19 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13 + 4)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x14)),0x1c);
          auVar20 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x24)),0x28);
          auVar19 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13 + 8)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x18)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar19,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x28)),0x28);
          auVar19 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x1c)),0x1c);
          auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x2c)),0x28);
        }
        else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar13 = uVar12 * pRVar7->stride;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(pcVar8 + lVar13 + 4);
          auVar48._8_8_ = 0;
          auVar48._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x10);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar13)),_DAT_01fbb140,auVar20)
          ;
          auVar20 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0xc)),_DAT_01fbb140,
                                       auVar48);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x18)),_DAT_01fbb140
                                            ,auVar16);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x28);
          auVar19 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x24)),_DAT_01fbb140,
                                       auVar17);
        }
        else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar13 = uVar12 * pRVar7->stride;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x10);
          auVar20 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(pcVar8 + lVar13 + 8)),0x20);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x34);
          auVar15 = vpermt2ps_avx512vl(auVar43,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar8 + lVar13)));
          auVar18._8_8_ = 0;
          auVar18._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x1c);
          fVar64 = *(float *)(pcVar8 + lVar13 + 0x24);
          fVar68 = *(float *)(pcVar8 + lVar13 + 0x28);
          fVar69 = *(float *)(pcVar8 + lVar13 + 0x2c);
          auVar16 = vpermt2ps_avx512vl(auVar18,_DAT_01fbb150,
                                       ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x18)));
          fVar70 = *(float *)(pcVar8 + lVar13 + 0x30);
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar68)),ZEXT416((uint)fVar64),
                                    ZEXT416((uint)fVar64));
          auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
          auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar70),ZEXT416((uint)fVar70));
          auVar17 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar19._0_4_));
          fVar57 = auVar17._0_4_;
          fVar57 = fVar57 * 1.5 + fVar57 * fVar57 * fVar57 * auVar19._0_4_ * -0.5;
          auVar19 = vinsertps_avx(auVar16,ZEXT416((uint)(fVar57 * fVar64)),0x30);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar15,ZEXT416((uint)(fVar57 * fVar68)),0x30);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar20,ZEXT416((uint)(fVar57 * fVar70)),0x30);
          auVar20 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar13 + 4)),0x10);
          auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x3c)),0x20);
          auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)(fVar69 * fVar57)),0x30);
        }
        else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar13 = uVar12 * pRVar7->stride;
          a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar8 + lVar13))->v;
          auVar20 = *(undefined1 (*) [16])(pcVar8 + lVar13 + 0x10);
          a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                          ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar8 + lVar13 + 0x20)
                          )->v;
          auVar19 = *(undefined1 (*) [16])(pcVar8 + lVar13 + 0x30);
        }
        auVar15 = vshufps_avx(auVar19,auVar19,0xff);
        auVar17 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
        auVar48 = vshufps_avx(auVar20,auVar20,0xff);
        auVar23 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
        auVar16 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])0x0,0xe9);
        auVar16 = vblendps_avx(auVar16,auVar20,4);
        fVar61 = auVar17._0_4_;
        auVar43 = vfmadd213ss_fma(auVar15,auVar15,ZEXT416((uint)(fVar61 * fVar61)));
        auVar43 = vfnmadd231ss_fma(auVar43,auVar48,auVar48);
        auVar18 = vfnmadd231ss_fma(auVar43,auVar23,auVar23);
        fVar57 = auVar15._0_4_;
        auVar21 = ZEXT416((uint)(auVar23._0_4_ * fVar57));
        auVar43 = vfmadd213ss_fma(auVar48,auVar17,auVar21);
        fVar64 = auVar43._0_4_ + auVar43._0_4_;
        auVar51 = ZEXT416((uint)(auVar48._0_4_ * fVar57));
        auVar43 = vfmsub213ss_fma(auVar23,auVar17,auVar51);
        fVar68 = auVar43._0_4_ + auVar43._0_4_;
        auVar43 = vfmsub231ss_fma(auVar21,auVar17,auVar48);
        fVar69 = auVar43._0_4_ + auVar43._0_4_;
        auVar43 = vfmsub231ss_fma(ZEXT416((uint)(fVar61 * fVar61)),auVar15,auVar15);
        auVar15 = vfmadd213ss_avx512f(auVar48,auVar48,auVar43);
        auVar21 = vfnmadd231ss_avx512f(auVar15,auVar23,auVar23);
        auVar15 = vfmadd213ss_avx512f(auVar23,auVar48,ZEXT416((uint)(fVar61 * fVar57)));
        auVar22 = vaddss_avx512f(auVar15,auVar15);
        auVar15 = vfmadd213ss_fma(auVar17,auVar23,auVar51);
        fVar70 = auVar15._0_4_ + auVar15._0_4_;
        auVar15 = vfmsub231ss_fma(ZEXT416((uint)(fVar61 * fVar57)),auVar48,auVar23);
        fVar57 = auVar15._0_4_ + auVar15._0_4_;
        auVar15 = vfnmadd231ss_fma(auVar43,auVar48,auVar48);
        auVar17 = vfmadd231ss_fma(auVar15,auVar23,auVar23);
        uVar44 = auVar18._0_4_;
        auVar65._4_4_ = uVar44;
        auVar65._0_4_ = uVar44;
        auVar65._8_4_ = uVar44;
        auVar65._12_4_ = uVar44;
        auVar71._4_4_ = fVar64;
        auVar71._0_4_ = fVar64;
        auVar71._8_4_ = fVar64;
        auVar71._12_4_ = fVar64;
        auVar73._0_4_ = fVar68 * 0.0;
        auVar73._4_4_ = fVar68 * 0.0;
        auVar73._8_4_ = fVar68 * 1.0;
        auVar73._12_4_ = fVar68 * 0.0;
        auVar43 = ZEXT816(0x3f80000000000000);
        auVar15 = vfmadd231ps_fma(auVar73,auVar43,auVar71);
        auVar18 = SUB6416(ZEXT464(0x3f800000),0);
        auVar48 = vfmadd231ps_fma(auVar15,auVar18,auVar65);
        auVar66._4_4_ = fVar69;
        auVar66._0_4_ = fVar69;
        auVar66._8_4_ = fVar69;
        auVar66._12_4_ = fVar69;
        auVar15 = vbroadcastss_avx512vl(auVar21);
        auVar23 = vbroadcastss_avx512vl(auVar22);
        auVar72._0_4_ = auVar23._0_4_ * 0.0;
        auVar72._4_4_ = auVar23._4_4_ * 0.0;
        auVar72._8_4_ = auVar23._8_4_ * 1.0;
        auVar72._12_4_ = auVar23._12_4_ * 0.0;
        auVar15 = vfmadd231ps_fma(auVar72,auVar43,auVar15);
        auVar23 = vfmadd231ps_fma(auVar15,auVar18,auVar66);
        auVar62._4_4_ = fVar70;
        auVar62._0_4_ = fVar70;
        auVar62._8_4_ = fVar70;
        auVar62._12_4_ = fVar70;
        auVar59._4_4_ = fVar57;
        auVar59._0_4_ = fVar57;
        auVar59._8_4_ = fVar57;
        auVar59._12_4_ = fVar57;
        fVar64 = auVar17._0_4_;
        auVar67._0_4_ = fVar64 * 0.0;
        auVar67._4_4_ = fVar64 * 0.0;
        auVar67._8_4_ = fVar64 * 1.0;
        auVar67._12_4_ = fVar64 * 0.0;
        auVar15 = vfmadd231ps_fma(auVar67,auVar43,auVar59);
        auVar15 = vfmadd231ps_fma(auVar15,auVar18,auVar62);
        auVar21._0_4_ = a0.field_0._0_4_;
        auVar21._4_4_ = auVar21._0_4_;
        auVar21._8_4_ = auVar21._0_4_;
        auVar21._12_4_ = auVar21._0_4_;
        fVar64 = auVar15._0_4_;
        auVar60._0_4_ = fVar64 * 0.0;
        fVar68 = auVar15._4_4_;
        auVar60._4_4_ = fVar68 * 0.0;
        fVar69 = auVar15._8_4_;
        auVar60._8_4_ = fVar69 * 0.0;
        fVar70 = auVar15._12_4_;
        auVar60._12_4_ = fVar70 * 0.0;
        auVar15 = vfmadd213ps_fma((undefined1  [16])0x0,auVar23,auVar60);
        auVar15 = vfmadd231ps_fma(auVar15,auVar48,auVar21);
        uVar44 = auVar20._0_4_;
        auVar63._4_4_ = uVar44;
        auVar63._0_4_ = uVar44;
        auVar63._8_4_ = uVar44;
        auVar63._12_4_ = uVar44;
        auVar20 = vshufps_avx(auVar20,auVar20,0x55);
        auVar20 = vfmadd213ps_fma(auVar20,auVar23,auVar60);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar20,auVar48,auVar63);
        iVar49 = a0_1.field_0._0_4_;
        auVar53._4_4_ = iVar49;
        auVar53._0_4_ = iVar49;
        auVar53._8_4_ = iVar49;
        auVar53._12_4_ = iVar49;
        auVar20 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
        auVar17 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
        auVar51._0_4_ = fVar64 * auVar17._0_4_;
        auVar51._4_4_ = fVar68 * auVar17._4_4_;
        auVar51._8_4_ = fVar69 * auVar17._8_4_;
        auVar51._12_4_ = fVar70 * auVar17._12_4_;
        auVar20 = vfmadd231ps_fma(auVar51,auVar23,auVar20);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar20,auVar48,auVar53);
        uVar44 = auVar19._0_4_;
        auVar54._4_4_ = uVar44;
        auVar54._0_4_ = uVar44;
        auVar54._8_4_ = uVar44;
        auVar54._12_4_ = uVar44;
        auVar20 = vshufps_avx(auVar19,auVar19,0x55);
        auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
        auVar22._0_4_ = fVar64 * auVar19._0_4_;
        auVar22._4_4_ = fVar68 * auVar19._4_4_;
        auVar22._8_4_ = fVar69 * auVar19._8_4_;
        auVar22._12_4_ = fVar70 * auVar19._12_4_;
        auVar19 = vfmadd231ps_fma(auVar22,auVar23,auVar20);
        auVar20 = vfmadd231ps_fma(auVar19,auVar48,auVar54);
        auVar19._0_4_ = auVar16._0_4_ + 0.0 + auVar20._0_4_;
        auVar19._4_4_ = auVar16._4_4_ + 0.0 + auVar20._4_4_;
        auVar19._8_4_ = auVar16._8_4_ + 0.0 + auVar20._8_4_;
        auVar19._12_4_ = auVar16._12_4_ + 0.0 + auVar20._12_4_;
      }
      else if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar13 = uVar12 * pRVar7->stride;
        auVar19 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13)),
                                ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x10)),0x1c);
        auVar15 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x20)),0x28);
        auVar19 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13 + 4)),
                                ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x14)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar19,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x24)),0x28);
        auVar19 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13 + 8)),
                                ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x18)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar19,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x28)),0x28);
        auVar19 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x1c)),0x1c);
        auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x2c)),0x28);
      }
      else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar13 = uVar12 * pRVar7->stride;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)(pcVar8 + lVar13 + 4);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x10);
        auVar15 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar13)),_DAT_01fbb140,auVar45);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0xc)),_DAT_01fbb140,
                                        auVar50);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x18)),_DAT_01fbb140,
                                          auVar46);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x28);
        auVar19 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x24)),_DAT_01fbb140,
                                     auVar55);
      }
      else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar13 = uVar12 * pRVar7->stride;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x10);
        auVar20 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar8 + lVar13 + 8)),0x20);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x34);
        auVar15 = vpermt2ps_avx512vl(auVar39,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar8 + lVar13)));
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)(pcVar8 + lVar13 + 0x1c);
        fVar64 = *(float *)(pcVar8 + lVar13 + 0x24);
        fVar68 = *(float *)(pcVar8 + lVar13 + 0x28);
        fVar69 = *(float *)(pcVar8 + lVar13 + 0x2c);
        auVar16 = vpermt2ps_avx512vl(auVar56,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x18)));
        fVar70 = *(float *)(pcVar8 + lVar13 + 0x30);
        auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar68)),ZEXT416((uint)fVar64),
                                  ZEXT416((uint)fVar64));
        auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
        auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar70),ZEXT416((uint)fVar70));
        auVar17 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar19._0_4_));
        fVar57 = auVar17._0_4_;
        fVar57 = fVar57 * 1.5 + fVar57 * fVar57 * fVar57 * auVar19._0_4_ * -0.5;
        auVar19 = vinsertps_avx(auVar16,ZEXT416((uint)(fVar57 * fVar64)),0x30);
        auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)(fVar57 * fVar68)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar20,ZEXT416((uint)(fVar57 * fVar70)),0x30);
        auVar20 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar8 + lVar13 + 4)),0x10);
        auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(pcVar8 + lVar13 + 0x3c)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar20,ZEXT416((uint)(fVar69 * fVar57)),0x30);
      }
      else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar13 = uVar12 * pRVar7->stride;
        auVar15 = *(undefined1 (*) [16])(pcVar8 + lVar13);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar8 + lVar13 + 0x10))->v
        ;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar8 + lVar13 + 0x20))
                        ->v;
        auVar19 = *(undefined1 (*) [16])(pcVar8 + lVar13 + 0x30);
      }
      auVar20 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
      auVar16 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
      auVar58._0_4_ = a0_1.field_0._0_4_ * auVar16._0_4_;
      auVar58._4_4_ = a0_1.field_0._4_4_ * auVar16._4_4_;
      auVar58._8_4_ = a0_1.field_0._8_4_ * auVar16._8_4_;
      auVar58._12_4_ = a0_1.field_0._12_4_ * auVar16._12_4_;
      auVar23 = vfmsub231ps_fma(auVar58,(undefined1  [16])a0.field_0,auVar20);
      auVar17 = vshufps_avx(auVar23,auVar23,0xc9);
      auVar48 = vshufps_avx(auVar15,auVar15,0xc9);
      auVar52._0_4_ = auVar15._0_4_ * auVar20._0_4_;
      auVar52._4_4_ = auVar15._4_4_ * auVar20._4_4_;
      auVar52._8_4_ = auVar15._8_4_ * auVar20._8_4_;
      auVar52._12_4_ = auVar15._12_4_ * auVar20._12_4_;
      auVar43 = vfmsub231ps_fma(auVar52,auVar48,(undefined1  [16])a0_1.field_0);
      auVar41._0_4_ = auVar48._0_4_ * a0.field_0._0_4_;
      auVar41._4_4_ = auVar48._4_4_ * a0.field_0._4_4_;
      auVar41._8_4_ = auVar48._8_4_ * a0.field_0._8_4_;
      auVar41._12_4_ = auVar48._12_4_ * a0.field_0._12_4_;
      auVar20 = vfmsub231ps_fma(auVar41,auVar15,auVar16);
      auVar18 = vpermi2ps_avx512vl(_DAT_01fbec70,auVar17,auVar20);
      auVar16 = vunpcklps_avx(auVar23,auVar20);
      auVar20 = vinsertps_avx(auVar43,auVar43,0x4a);
      auVar48 = vunpcklps_avx(auVar16,ZEXT416(auVar43._0_4_));
      auVar23 = vunpcklps_avx(auVar18,auVar20);
      auVar16 = vunpckhps_avx(auVar18,auVar20);
      auVar20 = vdpps_avx(auVar15,auVar17,0x7f);
      auVar40._0_4_ = auVar20._0_4_;
      auVar40._4_4_ = auVar40._0_4_;
      auVar40._8_4_ = auVar40._0_4_;
      auVar40._12_4_ = auVar40._0_4_;
      auVar20 = vdivps_avx(auVar23,auVar40);
      auVar15 = vdivps_avx(auVar16,auVar40);
      auVar16 = vdivps_avx(auVar48,auVar40);
      uVar44 = auVar19._0_4_;
      auVar42._4_4_ = uVar44;
      auVar42._0_4_ = uVar44;
      auVar42._8_4_ = uVar44;
      auVar42._12_4_ = uVar44;
      auVar17 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar47._0_4_ = auVar19._0_4_ * auVar16._0_4_;
      auVar47._4_4_ = auVar19._4_4_ * auVar16._4_4_;
      auVar47._8_4_ = auVar19._8_4_ * auVar16._8_4_;
      auVar47._12_4_ = auVar19._12_4_ * auVar16._12_4_;
      auVar19 = vfmadd231ps_fma(auVar47,auVar15,auVar17);
      auVar19 = vfmadd231ps_fma(auVar19,auVar20,auVar42);
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar19 = vxorps_avx512vl(auVar19,auVar10);
      auVar24 = vbroadcastss_avx512f(ZEXT416(1));
      auVar25 = vbroadcastss_avx512f(auVar20);
      auVar26 = vpermps_avx512f(auVar24,ZEXT1664(auVar20));
      auVar27 = vbroadcastss_avx512f(ZEXT416(2));
      auVar28 = vpermps_avx512f(auVar27,ZEXT1664(auVar20));
      auVar29 = vbroadcastss_avx512f(auVar15);
      auVar30 = vpermps_avx512f(auVar24,ZEXT1664(auVar15));
      auVar31 = vpermps_avx512f(auVar27,ZEXT1664(auVar15));
      auVar32 = vbroadcastss_avx512f(auVar16);
      auVar33 = vpermps_avx512f(auVar24,ZEXT1664(auVar16));
      auVar34 = vpermps_avx512f(auVar27,ZEXT1664(auVar16));
      auVar35 = vbroadcastss_avx512f(auVar19);
      auVar36 = vpermps_avx512f(auVar24,ZEXT1664(auVar19));
      auVar37 = vpermps_avx512f(auVar27,ZEXT1664(auVar19));
      auVar24 = *(undefined1 (*) [64])ray;
      auVar27 = *(undefined1 (*) [64])(ray + 0x40);
      auVar1 = *(undefined1 (*) [64])(ray + 0x80);
      auVar2 = *(undefined1 (*) [64])(ray + 0x100);
      auVar3 = *(undefined1 (*) [64])(ray + 0x140);
      auVar4 = *(undefined1 (*) [64])(ray + 0x180);
      auVar35 = vfmadd231ps_avx512f(auVar35,auVar1,auVar32);
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar1,auVar33);
      auVar37 = vfmadd231ps_avx512f(auVar37,auVar1,auVar34);
      auVar35 = vfmadd231ps_avx512f(auVar35,auVar27,auVar29);
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar27,auVar30);
      auVar37 = vfmadd231ps_avx512f(auVar37,auVar27,auVar31);
      auVar35 = vfmadd231ps_avx512f(auVar35,auVar24,auVar25);
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar24,auVar26);
      *(undefined1 (*) [64])ray = auVar35;
      auVar35 = vfmadd231ps_avx512f(auVar37,auVar24,auVar28);
      *(undefined1 (*) [64])(ray + 0x40) = auVar36;
      *(undefined1 (*) [64])(ray + 0x80) = auVar35;
      auVar32 = vmulps_avx512f(auVar4,auVar32);
      auVar33 = vmulps_avx512f(auVar4,auVar33);
      auVar34 = vmulps_avx512f(auVar4,auVar34);
      auVar29 = vfmadd231ps_avx512f(auVar32,auVar3,auVar29);
      auVar30 = vfmadd231ps_avx512f(auVar33,auVar3,auVar30);
      auVar31 = vfmadd231ps_avx512f(auVar34,auVar3,auVar31);
      auVar25 = vfmadd231ps_avx512f(auVar29,auVar2,auVar25);
      auVar26 = vfmadd231ps_avx512f(auVar30,auVar2,auVar26);
      auVar28 = vfmadd231ps_avx512f(auVar31,auVar2,auVar28);
      *(undefined1 (*) [64])(ray + 0x100) = auVar25;
      *(undefined1 (*) [64])(ray + 0x140) = auVar26;
      *(undefined1 (*) [64])(ray + 0x180) = auVar28;
      auVar25 = vpmovm2d_avx512dq((ulong)uVar14);
      local_c0[0] = vmovdqa64_avx512f(auVar25);
      (**(code **)&pAVar11->field_0x128)(local_c0,&(pAVar11->super_AccelData).field_0x58,ray);
      local_180 = auVar24._0_8_;
      uStack_178 = auVar24._8_8_;
      uStack_170 = auVar24._16_8_;
      uStack_168 = auVar24._24_8_;
      uStack_160 = auVar24._32_8_;
      uStack_158 = auVar24._40_8_;
      uStack_150 = auVar24._48_8_;
      uStack_148 = auVar24._56_8_;
      *(undefined8 *)ray = local_180;
      *(undefined8 *)(ray + 8) = uStack_178;
      *(undefined8 *)(ray + 0x10) = uStack_170;
      *(undefined8 *)(ray + 0x18) = uStack_168;
      *(undefined8 *)(ray + 0x20) = uStack_160;
      *(undefined8 *)(ray + 0x28) = uStack_158;
      *(undefined8 *)(ray + 0x30) = uStack_150;
      *(undefined8 *)(ray + 0x38) = uStack_148;
      local_140 = auVar27._0_8_;
      uStack_138 = auVar27._8_8_;
      uStack_130 = auVar27._16_8_;
      uStack_128 = auVar27._24_8_;
      uStack_120 = auVar27._32_8_;
      uStack_118 = auVar27._40_8_;
      uStack_110 = auVar27._48_8_;
      uStack_108 = auVar27._56_8_;
      *(undefined8 *)(ray + 0x40) = local_140;
      *(undefined8 *)(ray + 0x48) = uStack_138;
      *(undefined8 *)(ray + 0x50) = uStack_130;
      *(undefined8 *)(ray + 0x58) = uStack_128;
      *(undefined8 *)(ray + 0x60) = uStack_120;
      *(undefined8 *)(ray + 0x68) = uStack_118;
      *(undefined8 *)(ray + 0x70) = uStack_110;
      *(undefined8 *)(ray + 0x78) = uStack_108;
      local_100 = auVar1._0_8_;
      uStack_f8 = auVar1._8_8_;
      uStack_f0 = auVar1._16_8_;
      uStack_e8 = auVar1._24_8_;
      uStack_e0 = auVar1._32_8_;
      uStack_d8 = auVar1._40_8_;
      uStack_d0 = auVar1._48_8_;
      uStack_c8 = auVar1._56_8_;
      *(undefined8 *)(ray + 0x80) = local_100;
      *(undefined8 *)(ray + 0x88) = uStack_f8;
      *(undefined8 *)(ray + 0x90) = uStack_f0;
      *(undefined8 *)(ray + 0x98) = uStack_e8;
      *(undefined8 *)(ray + 0xa0) = uStack_e0;
      *(undefined8 *)(ray + 0xa8) = uStack_d8;
      *(undefined8 *)(ray + 0xb0) = uStack_d0;
      *(undefined8 *)(ray + 0xb8) = uStack_c8;
      local_240 = auVar2._0_8_;
      uStack_238 = auVar2._8_8_;
      uStack_230 = auVar2._16_8_;
      uStack_228 = auVar2._24_8_;
      uStack_220 = auVar2._32_8_;
      uStack_218 = auVar2._40_8_;
      uStack_210 = auVar2._48_8_;
      uStack_208 = auVar2._56_8_;
      *(undefined8 *)(ray + 0x100) = local_240;
      *(undefined8 *)(ray + 0x108) = uStack_238;
      *(undefined8 *)(ray + 0x110) = uStack_230;
      *(undefined8 *)(ray + 0x118) = uStack_228;
      *(undefined8 *)(ray + 0x120) = uStack_220;
      *(undefined8 *)(ray + 0x128) = uStack_218;
      *(undefined8 *)(ray + 0x130) = uStack_210;
      *(undefined8 *)(ray + 0x138) = uStack_208;
      local_200 = auVar3._0_8_;
      uStack_1f8 = auVar3._8_8_;
      uStack_1f0 = auVar3._16_8_;
      uStack_1e8 = auVar3._24_8_;
      uStack_1e0 = auVar3._32_8_;
      uStack_1d8 = auVar3._40_8_;
      uStack_1d0 = auVar3._48_8_;
      uStack_1c8 = auVar3._56_8_;
      *(undefined8 *)(ray + 0x140) = local_200;
      *(undefined8 *)(ray + 0x148) = uStack_1f8;
      *(undefined8 *)(ray + 0x150) = uStack_1f0;
      *(undefined8 *)(ray + 0x158) = uStack_1e8;
      *(undefined8 *)(ray + 0x160) = uStack_1e0;
      *(undefined8 *)(ray + 0x168) = uStack_1d8;
      *(undefined8 *)(ray + 0x170) = uStack_1d0;
      *(undefined8 *)(ray + 0x178) = uStack_1c8;
      auVar24 = vmovdqa64_avx512f(auVar4);
      auVar24 = vmovdqa64_avx512f(auVar24);
      *(undefined1 (*) [64])(ray + 0x180) = auVar24;
      pRVar6->instID[0] = 0xffffffff;
      pRVar6->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorK<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3vf<K> world2local = instance->getWorld2Local(prim.primID_);
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }